

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

bool __thiscall AbstractModuleClient::sendSettleCommand(AbstractModuleClient *this)

{
  bool bVar1;
  TrodesMsg m;
  allocator local_51;
  string local_50;
  TrodesMsg local_30;
  
  TrodesMsg::TrodesMsg(&local_30);
  std::__cxx11::string::string((string *)&local_50,"s",&local_51);
  TrodesMsg::addcontents<char_const*>(&local_30,&local_50,"_settle");
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = MlmWrap::sendHardwareMessage(&this->super_MlmWrap,&local_30);
  TrodesMsg::~TrodesMsg(&local_30);
  return bVar1;
}

Assistant:

bool AbstractModuleClient::sendSettleCommand(){
    TrodesMsg m;
    m.addcontents("s", settle_CMD);
    return sendHardwareMessage(m);
}